

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

void kmp_create_affinity_mask(void **mask)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  iVar1 = (*__kmp_affinity_dispatch->_vptr_KMPAffinity[4])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  (**(code **)(*plVar2 + 0x28))(plVar2);
  *mask = plVar2;
  return;
}

Assistant:

void FTN_STDCALL FTN_CREATE_AFFINITY_MASK(void **mask) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  *mask = NULL;
#else
  // We really only NEED serial initialization here.
  kmp_affin_mask_t *mask_internals;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  mask_internals = __kmp_affinity_dispatch->allocate_mask();
  KMP_CPU_ZERO(mask_internals);
  *mask = mask_internals;
#endif
}